

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<int_const&>::operator<
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,optional<long> *rhs)

{
  lest *this_00;
  optional<long> *in_R8;
  allocator<char> local_69;
  string local_68 [32];
  string local_48;
  bool local_21;
  string *local_20;
  optional<long> *rhs_local;
  expression_lhs<const_int_&> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (optional<long> *)this;
  this_local = (expression_lhs<const_int_&> *)__return_storage_ptr__;
  local_21 = std::enable_if<is_convertible<decltype(((std::declval<int_const&>)())<((std::
             declval<long_const&>)())),bool>::value,bool>::type_std::operator<(*(int **)this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"<",&local_69);
  to_string<int,std::optional<long>>(&local_48,this_00,(int *)local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }